

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnrichableSpiSimulationDataGenerator.cpp
# Opt level: O3

U32 __thiscall
EnrichableSpiSimulationDataGenerator::GenerateSimulationData
          (EnrichableSpiSimulationDataGenerator *this,U64 largest_sample_requested,U32 sample_rate,
          SimulationChannelDescriptor **simulation_channels)

{
  U32 UVar1;
  ulong uVar2;
  ulong uVar3;
  SimulationChannelDescriptor *pSVar4;
  
  uVar2 = AnalyzerHelpers::AdjustSimulationTargetSample
                    (largest_sample_requested,sample_rate,this->mSimulationSampleRateHz);
  uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
  if (uVar3 < uVar2) {
    do {
      CreateSpiTransaction(this);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptorGroup::AdvanceAll((int)this + 0x20);
      uVar3 = SimulationChannelDescriptor::GetCurrentSampleNumber();
    } while (uVar3 < uVar2);
  }
  pSVar4 = (SimulationChannelDescriptor *)SimulationChannelDescriptorGroup::GetArray();
  *simulation_channels = pSVar4;
  UVar1 = SimulationChannelDescriptorGroup::GetCount();
  return UVar1;
}

Assistant:

U32 EnrichableSpiSimulationDataGenerator::GenerateSimulationData( U64 largest_sample_requested, U32 sample_rate, SimulationChannelDescriptor** simulation_channels )
{
	U64 adjusted_largest_sample_requested = AnalyzerHelpers::AdjustSimulationTargetSample( largest_sample_requested, sample_rate, mSimulationSampleRateHz );

	while( mClock->GetCurrentSampleNumber() < adjusted_largest_sample_requested )
	{
		CreateSpiTransaction();

		mEnrichableSpiSimulationChannels.AdvanceAll( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); //insert 10 bit-periods of idle
	}

	*simulation_channels = mEnrichableSpiSimulationChannels.GetArray();
	return mEnrichableSpiSimulationChannels.GetCount();
}